

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeRunJustOnce(Parse *pParse,Expr *pExpr,int regDest)

{
  Vdbe *p;
  int iVar1;
  Expr *pExpr_00;
  ExprList *pEVar2;
  Op *pOVar3;
  int iVar4;
  sqlite3 *db;
  anon_union_4_2_6146edf4_for_u *paVar5;
  
  pEVar2 = pParse->pConstExpr;
  if ((pEVar2 != (ExprList *)0x0 && regDest < 0) && (0 < pEVar2->nExpr)) {
    iVar4 = pEVar2->nExpr + 1;
    paVar5 = &pEVar2->a[0].u;
    do {
      if (((paVar5->iConstExprReg & 0x80000000000U) != 0) &&
         (iVar1 = sqlite3ExprCompare((Parse *)0x0,((ExprList_item *)(paVar5 + -5))->pExpr,pExpr,-1),
         iVar1 == 0)) {
        return paVar5->iConstExprReg;
      }
      iVar4 = iVar4 + -1;
      paVar5 = paVar5 + 6;
    } while (1 < iVar4);
  }
  if ((pExpr == (Expr *)0x0) ||
     (pExpr_00 = exprDup(pParse->db,pExpr,0,(EdupBuf *)0x0), pExpr_00 == (Expr *)0x0)) {
    pExpr_00 = (Expr *)0x0;
  }
  else if ((pExpr_00->flags & 8) != 0) {
    p = pParse->pVdbe;
    iVar4 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
    pParse->okConstFactor = '\0';
    db = pParse->db;
    if (db->mallocFailed == '\0') {
      if (regDest < 0) {
        regDest = pParse->nMem + 1;
        pParse->nMem = regDest;
      }
      sqlite3ExprCode(pParse,pExpr_00,regDest);
      db = pParse->db;
    }
    pParse->okConstFactor = '\x01';
    sqlite3ExprDeleteNN(db,pExpr_00);
    if (p->db->mallocFailed == '\0') {
      pOVar3 = p->aOp + iVar4;
    }
    else {
      pOVar3 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar3->p2 = p->nOp;
    return regDest;
  }
  pEVar2 = sqlite3ExprListAppend(pParse,pEVar2,pExpr_00);
  if (pEVar2 != (ExprList *)0x0) {
    iVar4 = pEVar2->nExpr;
    *(ushort *)&pEVar2->a[(long)iVar4 + -1].fg.field_0x1 =
         (*(ushort *)&pEVar2->a[(long)iVar4 + -1].fg.field_0x1 & 0xfff7) +
         (short)(regDest >> 0x1f) * -8;
    if (regDest < 0) {
      regDest = pParse->nMem + 1;
      pParse->nMem = regDest;
    }
    pEVar2->a[(long)iVar4 + -1].u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = pEVar2;
  return regDest;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeRunJustOnce(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  assert( regDest!=0 );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->fg.reusable
       && sqlite3ExprCompare(0,pItem->pExpr,pExpr,-1)==0
      ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  if( pExpr!=0 && ExprHasProperty(pExpr, EP_HasFunc) ){
    Vdbe *v = pParse->pVdbe;
    int addr;
    assert( v );
    addr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    pParse->okConstFactor = 0;
    if( !pParse->db->mallocFailed ){
      if( regDest<0 ) regDest = ++pParse->nMem;
      sqlite3ExprCode(pParse, pExpr, regDest);
    }
    pParse->okConstFactor = 1;
    sqlite3ExprDelete(pParse->db, pExpr);
    sqlite3VdbeJumpHere(v, addr);
  }else{
    p = sqlite3ExprListAppend(pParse, p, pExpr);
    if( p ){
       struct ExprList_item *pItem = &p->a[p->nExpr-1];
       pItem->fg.reusable = regDest<0;
       if( regDest<0 ) regDest = ++pParse->nMem;
       pItem->u.iConstExprReg = regDest;
    }
    pParse->pConstExpr = p;
  }
  return regDest;
}